

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_2b281f::CAPITask::start(CAPITask *this,TaskInterface ti)

{
  llb_task_interface_t lVar1;
  BuildEngineDelegate *pBVar2;
  TaskInterface local_20;
  
  local_20.ctx = ti.ctx;
  local_20.impl = ti.impl;
  pBVar2 = llbuild::core::TaskInterface::delegate(&local_20);
  lVar1.ctx = local_20.ctx;
  lVar1.impl = local_20.impl;
  (*(this->cAPIDelegate).start)
            ((this->cAPIDelegate).context,pBVar2[2]._vptr_BuildEngineDelegate,lVar1);
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    CAPIBuildEngineDelegate* delegate =
      static_cast<CAPIBuildEngineDelegate*>(ti.delegate());
    cAPIDelegate.start(cAPIDelegate.context,
                       delegate->cAPIDelegate.context,
                       *reinterpret_cast<llb_task_interface_t*>(&ti));
  }